

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_util.h
# Opt level: O1

bool google::protobuf::
     InsertIfNotPresent<std::unordered_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>>>>
               (unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                *collection,first_type *key,second_type *value)

{
  __node_base *p_Var1;
  size_type *psVar2;
  _Hash_node_base *p_Var3;
  __buckets_ptr pp_Var4;
  __node_ptr p_Var5;
  _Hash_node_base *p_Var6;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var7;
  ulong uVar8;
  size_type __n;
  ulong uVar9;
  char cVar10;
  _Hash_node_base _Var11;
  _Hash_node_base *p_Var12;
  pointer __ptr_1;
  undefined1 auVar13 [16];
  __buckets_alloc_type __alloc;
  new_allocator<std::__detail::_Hash_node_base_*> local_59;
  key_type local_58;
  second_type local_48;
  size_t local_38;
  
  local_58.first = key->first;
  local_58.second = key->second;
  local_48 = *value;
  cVar10 = *(char *)&((_Hash_node_base *)local_58.second)->_M_nxt;
  if (cVar10 == '\0') {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    p_Var12 = (_Hash_node_base *)local_58.second;
    do {
      p_Var12 = (_Hash_node_base *)((long)&p_Var12->_M_nxt + 1);
      uVar8 = (long)cVar10 + uVar8 * 5;
      cVar10 = *(char *)&p_Var12->_M_nxt;
    } while (cVar10 != '\0');
  }
  p_Var12 = (_Hash_node_base *)((long)local_58.first * 0x1000193 ^ uVar8);
  uVar8 = (ulong)p_Var12 % (collection->_M_h)._M_bucket_count;
  p_Var5 = std::
           _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&collection->_M_h,uVar8,&local_58,(__hash_code)p_Var12);
  if (p_Var5 == (__node_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)operator_new(0x28);
    p_Var6->_M_nxt = (_Hash_node_base *)0x0;
    p_Var6[1]._M_nxt = (_Hash_node_base *)local_58.first;
    p_Var6[2]._M_nxt = (_Hash_node_base *)local_58.second;
    p_Var6[3]._M_nxt = (_Hash_node_base *)local_48;
    local_38 = (collection->_M_h)._M_rehash_policy._M_next_resize;
    auVar13 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(collection->_M_h)._M_rehash_policy,
                         (collection->_M_h)._M_bucket_count,(collection->_M_h)._M_element_count);
    __n = auVar13._8_8_;
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        __s = &(collection->_M_h)._M_single_bucket;
        (collection->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        (&local_59,__n,(void *)0x0);
        memset(__s,0,__n * 8);
      }
      _Var11._M_nxt = (collection->_M_h)._M_before_begin._M_nxt;
      (collection->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var11._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(collection->_M_h)._M_before_begin;
        uVar8 = 0;
        do {
          p_Var3 = (_Var11._M_nxt)->_M_nxt;
          uVar9 = (ulong)_Var11._M_nxt[4]._M_nxt % __n;
          if (__s[uVar9] == (_Hash_node_base *)0x0) {
            (_Var11._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var11._M_nxt;
            __s[uVar9] = p_Var1;
            if ((_Var11._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var7 = __s + uVar8;
              goto LAB_002ca717;
            }
          }
          else {
            (_Var11._M_nxt)->_M_nxt = __s[uVar9]->_M_nxt;
            pp_Var7 = &__s[uVar9]->_M_nxt;
            uVar9 = uVar8;
LAB_002ca717:
            *pp_Var7 = _Var11._M_nxt;
          }
          _Var11._M_nxt = p_Var3;
          uVar8 = uVar9;
        } while (p_Var3 != (_Hash_node_base *)0x0);
      }
      pp_Var4 = (collection->_M_h)._M_buckets;
      if (&(collection->_M_h)._M_single_bucket != pp_Var4) {
        operator_delete(pp_Var4);
      }
      (collection->_M_h)._M_bucket_count = __n;
      (collection->_M_h)._M_buckets = __s;
      uVar8 = (ulong)p_Var12 % __n;
    }
    p_Var6[4]._M_nxt = p_Var12;
    pp_Var4 = (collection->_M_h)._M_buckets;
    if (pp_Var4[uVar8] == (__node_base_ptr)0x0) {
      p_Var12 = (collection->_M_h)._M_before_begin._M_nxt;
      p_Var6->_M_nxt = p_Var12;
      (collection->_M_h)._M_before_begin._M_nxt = p_Var6;
      if (p_Var12 != (_Hash_node_base *)0x0) {
        pp_Var4[(ulong)p_Var12[4]._M_nxt % (collection->_M_h)._M_bucket_count] = p_Var6;
      }
      (collection->_M_h)._M_buckets[uVar8] = &(collection->_M_h)._M_before_begin;
    }
    else {
      p_Var6->_M_nxt = pp_Var4[uVar8]->_M_nxt;
      pp_Var4[uVar8]->_M_nxt = p_Var6;
    }
    psVar2 = &(collection->_M_h)._M_element_count;
    *psVar2 = *psVar2 + 1;
  }
  return p_Var5 == (__node_ptr)0x0;
}

Assistant:

bool InsertIfNotPresent(
    Collection* const collection,
    const typename Collection::value_type::first_type& key,
    const typename Collection::value_type::second_type& value) {
  return InsertIfNotPresent(
      collection, typename Collection::value_type(key, value));
}